

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O2

ssize_t __thiscall
brynet::net::DataSocket::send(DataSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  PACKET_PTR packetCapture;
  DataSocket *local_98;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_90;
  _Any_data local_80;
  long local_70;
  undefined8 uStack_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  PACKED_SENDED_CALLBACK callbackCapture;
  
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&packetCapture.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)CONCAT44(in_register_00000034,__fd));
  std::function<void_()>::function(&callbackCapture,(function<void_()> *)__buf);
  this_00 = (this->mEventLoop).
            super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98 = this;
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_90,
                 &packetCapture.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::function<void_()>::function((function<void_()> *)&local_80,&callbackCapture);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x38);
  _Var1._M_pi = _Stack_90._M_refcount._M_pi;
  *(DataSocket **)local_58._M_unused._0_8_ = local_98;
  *(element_type **)((long)local_58._M_unused._0_8_ + 8) = _Stack_90._M_ptr;
  _Stack_90._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x10) =
       _Var1._M_pi;
  _Stack_90._M_ptr = (element_type *)0x0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x20) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x28) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x30) = uStack_68;
  if (local_70 != 0) {
    *(void **)((long)local_58._M_unused._0_8_ + 0x18) = local_80._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x20) = local_80._8_8_;
    *(long *)((long)local_58._M_unused._0_8_ + 0x28) = local_70;
    local_70 = 0;
    uStack_68 = 0;
  }
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp:128:31)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp:128:31)>
             ::_M_manager;
  EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  send(std::shared_ptr<std::__cxx11::string>const&,std::function<void()>const&)::$_0::~__0
            ((__0 *)&local_98);
  std::_Function_base::~_Function_base(&callbackCapture.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&packetCapture.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return extraout_RAX;
}

Assistant:

void DataSocket::send(const PACKET_PTR& packet, const PACKED_SENDED_CALLBACK& callback)
{
    auto packetCapture = packet;
    auto callbackCapture = callback;
    mEventLoop->pushAsyncProc([this, packetCapture, callbackCapture](){
        auto len = packetCapture->size();
        mSendList.push_back({ std::move(packetCapture), len, std::move(callbackCapture) });
        runAfterFlush();
    });
}